

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

uint32_t sect_GetAlignBytes(uint8_t alignment,uint16_t offset)

{
  int iVar1;
  byte *pbVar2;
  uint local_24;
  uint8_t local_1a;
  undefined1 local_19;
  uint16_t pcValue;
  uint8_t curAlignment;
  Section *pSStack_18;
  bool isFixed;
  Section *sect;
  uint16_t offset_local;
  uint8_t alignment_local;
  
  sect._0_2_ = offset;
  sect._3_1_ = alignment;
  pSStack_18 = sect_GetSymbolSection();
  if (pSStack_18 == (Section *)0x0) {
    sect._4_4_ = 0;
  }
  else {
    local_19 = pSStack_18->org != 0xffffffff;
    if ((bool)local_19) {
      local_1a = '\x10';
    }
    else {
      local_1a = pSStack_18->align;
    }
    if (local_1a == '\0') {
      sect._4_4_ = 0;
    }
    else {
      if ((bool)local_19) {
        local_24 = pSStack_18->org;
      }
      else {
        local_24 = (uint)pSStack_18->alignOfs;
      }
      iVar1 = (uint16_t)sect - curOffset;
      pbVar2 = std::min<unsigned_char>((uchar *)((long)&sect + 3),&local_1a);
      sect._4_4_ = (iVar1 - (local_24 & 0xffff) & 0xffff) % (uint)(1 << (*pbVar2 & 0x1f));
    }
  }
  return sect._4_4_;
}

Assistant:

uint32_t sect_GetAlignBytes(uint8_t alignment, uint16_t offset)
{
	struct Section *sect = sect_GetSymbolSection();
	if (!sect)
		return 0;

	bool isFixed = sect->org != (uint32_t)-1;

	// If the section is not aligned, no bytes are needed
	// (fixed sections count as being maximally aligned for this purpose)
	uint8_t curAlignment = isFixed ? 16 : sect->align;
	if (curAlignment == 0)
		return 0;

	// We need `(pcValue + curOffset + return value) % (1 << alignment) == offset`
	uint16_t pcValue = isFixed ? sect->org : sect->alignOfs;
	return static_cast<uint16_t>(offset - curOffset - pcValue)
		% (1u << std::min(alignment, curAlignment));
}